

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitset_contains_all(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = b1->arraysize;
  uVar1 = b2->arraysize;
  uVar3 = uVar1;
  if (uVar4 < uVar1) {
    uVar3 = uVar4;
  }
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      if ((b2->array[uVar5] & ~b1->array[uVar5]) != 0) goto LAB_00101ecc;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  _Var2 = true;
  if (uVar4 < uVar1) {
    if (b2->array[uVar4] == 0) {
      do {
        uVar4 = uVar4 + 1;
        if (uVar1 == uVar4) break;
      } while (b2->array[uVar4] == 0);
      return uVar1 <= uVar4;
    }
LAB_00101ecc:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool bitset_contains_all(const bitset_t * CBITSET_RESTRICT b1, const bitset_t * CBITSET_RESTRICT b2) {
  size_t min_size = b1->arraysize;
  if(b1->arraysize > b2->arraysize) {
    min_size = b2->arraysize;
  }
  for(size_t k = 0; k < min_size; k++) {
    if((b1->array[k] & b2->array[k]) != b2->array[k]) {
      return false;
    }
  }
  if(b2->arraysize > b1->arraysize) {
    /* Need to check if b2 has any bits set beyond b1's array */
    return !any_bits_set(b2, b1->arraysize);
  }
  return true;
}